

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

void __thiscall ZXing::Pdf417::Writer::Writer(Writer *this)

{
  Encoder *pEVar1;
  
  this->_margin = -1;
  this->_ecLevel = -1;
  (this->_encoder)._M_t.
  super___uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>._M_t.
  super__Tuple_impl<0UL,_ZXing::Pdf417::Encoder_*,_std::default_delete<ZXing::Pdf417::Encoder>_>.
  super__Head_base<0UL,_ZXing::Pdf417::Encoder_*,_false>._M_head_impl = (Encoder *)0x0;
  pEVar1 = (Encoder *)operator_new(0x1c);
  pEVar1->_compact = false;
  pEVar1->_compaction = AUTO;
  pEVar1->_encoding = ISO8859_1;
  pEVar1->_minCols = 2;
  pEVar1->_maxCols = 0x1e;
  pEVar1->_minRows = 2;
  pEVar1->_maxRows = 0x1e;
  (this->_encoder)._M_t.
  super___uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>._M_t.
  super__Tuple_impl<0UL,_ZXing::Pdf417::Encoder_*,_std::default_delete<ZXing::Pdf417::Encoder>_>.
  super__Head_base<0UL,_ZXing::Pdf417::Encoder_*,_false>._M_head_impl = pEVar1;
  return;
}

Assistant:

Writer::Writer()
{
	_encoder.reset(new Encoder);
}